

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-transform.cpp
# Opt level: O1

Transform * __thiscall gepard::Transform::multiply(Transform *this,Transform *transform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = this->data[0];
  dVar2 = this->data[1];
  dVar3 = this->data[2];
  dVar4 = this->data[3];
  this->data[0] = transform->data[0] * dVar1 + transform->data[1] * dVar3;
  this->data[1] = transform->data[0] * dVar2 + transform->data[1] * dVar4;
  this->data[2] = transform->data[2] * dVar1 + transform->data[3] * dVar3;
  this->data[3] = transform->data[2] * dVar2 + transform->data[3] * dVar4;
  dVar5 = transform->data[4];
  dVar6 = transform->data[5];
  if ((((dVar5 == 0.0) && (!NAN(dVar5))) && (dVar6 == 0.0)) && (!NAN(dVar6))) {
    return this;
  }
  this->data[4] = dVar1 * dVar5 + dVar3 * dVar6 + this->data[4];
  this->data[5] = dVar2 * transform->data[4] + dVar4 * transform->data[5] + this->data[5];
  return this;
}

Assistant:

Transform&Transform::multiply(const Transform& transform)
{
    const Float a = data[0];
    const Float b = data[1];
    const Float c = data[2];
    const Float d = data[3];

    data[0] = a * transform.data[0] + c * transform.data[1];
    data[1] = b * transform.data[0] + d * transform.data[1];
    data[2] = a * transform.data[2] + c * transform.data[3];
    data[3] = b * transform.data[2] + d * transform.data[3];
    if (transform.data[4] || transform.data[5]) {
        data[4] += a * transform.data[4] + c * transform.data[5];
        data[5] += b * transform.data[4] + d * transform.data[5];
    }
    return *this;
}